

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEdit::setKeySequence(QKeySequenceEdit *this,QKeySequence *keySequence)

{
  QKeySequenceEditPrivate *pQVar1;
  ulong uVar2;
  int *piVar3;
  QKeySequence *in_RSI;
  QKeySequenceEditPrivate *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  QKeySequenceEditPrivate *d;
  int desiredCount;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QKeySequenceEditPrivate *in_stack_ffffffffffffff80;
  QLineEdit *this_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  QKeySequenceEditPrivate *this_01;
  undefined1 local_50 [24];
  int local_38;
  int local_34;
  char local_30 [36];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar1 = d_func((QKeySequenceEdit *)0x5a6e35);
  QKeySequenceEditPrivate::resetState(this_01);
  uVar2 = QKeySequence::operator==(&pQVar1->keySequence,in_RSI);
  if ((uVar2 & 1) == 0) {
    local_c = QKeySequence::count();
    if (pQVar1->maximumSequenceLength < (int)local_c) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QMessageLogger::warning
                (local_30,
                 "QKeySequenceEdit: setting a key sequence of length %d when maximumSequenceLength is %d, truncating."
                 ,(ulong)local_c,(ulong)(uint)pQVar1->maximumSequenceLength);
    }
    piVar3 = std::min<int>((int *)&local_c,&pQVar1->maximumSequenceLength);
    pQVar1->keyNum = *piVar3;
    for (iVar4 = 0; iVar4 < pQVar1->keyNum; iVar4 = iVar4 + 1) {
      local_34 = QKeySequence::operator[]((uint)in_RSI);
      pQVar1->key[iVar4].combination = local_34;
    }
    for (iVar4 = pQVar1->keyNum; iVar4 < 4; iVar4 = iVar4 + 1) {
      local_38 = (int)QKeyCombination::fromCombined(in_stack_ffffffffffffff78);
      pQVar1->key[iVar4].combination = local_38;
    }
    QKeySequenceEditPrivate::rebuildKeySequence(in_stack_ffffffffffffff80);
    this_00 = pQVar1->lineEdit;
    QKeySequence::toString((SequenceFormat)local_50);
    QLineEdit::setText(this_00,(QString *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QString::~QString((QString *)0x5a6fb8);
    keySequenceChanged((QKeySequenceEdit *)this_00,
                       (QKeySequence *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                      );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKeySequenceEdit::setKeySequence(const QKeySequence &keySequence)
{
    Q_D(QKeySequenceEdit);

    d->resetState();

    if (d->keySequence == keySequence)
        return;

    const auto desiredCount = keySequence.count();
    if (desiredCount > d->maximumSequenceLength) {
        qWarning("QKeySequenceEdit: setting a key sequence of length %d "
                 "when maximumSequenceLength is %d, truncating.",
                 desiredCount, d->maximumSequenceLength);
    }

    d->keyNum = std::min(desiredCount, d->maximumSequenceLength);
    for (int i = 0; i < d->keyNum; ++i)
        d->key[i] = keySequence[i];
    for (int i = d->keyNum; i < QKeySequencePrivate::MaxKeyCount; ++i)
        d->key[i] = QKeyCombination::fromCombined(0);

    d->rebuildKeySequence();

    d->lineEdit->setText(d->keySequence.toString(QKeySequence::NativeText));

    emit keySequenceChanged(d->keySequence);
}